

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ut_map.hpp
# Opt level: O0

bool __thiscall
cappuccino::
ut_map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>
::do_insert_update(ut_map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>
                   *this,unsigned_long *key,
                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value,
                  time_point expire_time,allow a)

{
  bool bVar1;
  _Self local_48;
  _Self local_40;
  iterator keyed_position;
  allow a_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value_local;
  unsigned_long *key_local;
  ut_map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>
  *this_local;
  time_point expire_time_local;
  
  keyed_position._M_node = (_Base_ptr)a;
  local_40._M_node =
       (_Base_ptr)
       std::
       map<unsigned_long,_cappuccino::ut_map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>::keyed_element,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_cappuccino::ut_map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>::keyed_element>_>_>
       ::find(&this->m_keyed_elements,key);
  local_48._M_node =
       (_Base_ptr)
       std::
       map<unsigned_long,_cappuccino::ut_map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>::keyed_element,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_cappuccino::ut_map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>::keyed_element>_>_>
       ::end(&this->m_keyed_elements);
  bVar1 = std::operator!=(&local_40,&local_48);
  if (bVar1) {
    bVar1 = update_allowed((allow)keyed_position._M_node);
    if (bVar1) {
      do_update(this,(keyed_iterator)local_40._M_node,value,expire_time);
      return true;
    }
  }
  else {
    bVar1 = insert_allowed((allow)keyed_position._M_node);
    if (bVar1) {
      do_insert(this,key,value,expire_time);
      return true;
    }
  }
  return false;
}

Assistant:

auto do_insert_update(
        const key_type& key, value_type&& value, std::chrono::steady_clock::time_point expire_time, allow a) -> bool
    {
        const auto keyed_position = m_keyed_elements.find(key);
        if (keyed_position != m_keyed_elements.end())
        {
            if (update_allowed(a))
            {
                do_update(keyed_position, std::move(value), expire_time);
                return true;
            }
        }
        else
        {
            if (insert_allowed(a))
            {
                do_insert(key, std::move(value), expire_time);
                return true;
            }
        }
        return false;
    }